

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

Estimate<double> * __thiscall
Catch::Benchmark::Detail::
bootstrap<double(*&)(__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>)>
          (Estimate<double> *__return_storage_ptr__,Detail *this,double confidence_level,
          iterator first,iterator last,sample *resample,
          _func_double___normal_iterator<const_double_ptr,_std::vector<double,_std::allocator<double>_>_>___normal_iterator<const_double_ptr,_std::vector<double,_std::allocator<double>_>_>
          **estimator)

{
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> __first;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> __last;
  difference_type dVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  iterator last_00;
  iterator __end3;
  iterator __begin3;
  long lVar5;
  _Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_jbaldwin[P]libcappuccino_test_catch_hpp:1998:81)>
  __pred;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  anon_class_8_1_54a3980e cumn;
  sample jack;
  anon_class_8_1_54a3980e local_50;
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  last_00._M_current = (double *)resample;
  __pred._M_pred.point =
       (anon_class_8_1_a87844b0_for__M_pred)
       (*(code *)(resample->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start)(this,first._M_current);
  if ((long)first._M_current - (long)this == 8) {
    __return_storage_ptr__->point = (double)__pred._M_pred.point;
    __return_storage_ptr__->lower_bound = (double)__pred._M_pred.point;
    __return_storage_ptr__->upper_bound = (double)__pred._M_pred.point;
    __return_storage_ptr__->confidence_interval = confidence_level;
  }
  else {
    jackknife<double(*&)(__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>)>
              ((sample *)&local_48,(Detail *)resample,
               (_func_double___normal_iterator<const_double_ptr,_std::vector<double,_std::allocator<double>_>_>___normal_iterator<const_double_ptr,_std::vector<double,_std::allocator<double>_>_>
                **)this,first,last_00);
    dVar6 = mean((const_iterator)local_48._M_impl.super__Vector_impl_data._M_start,
                 (const_iterator)local_48._M_impl.super__Vector_impl_data._M_finish);
    dVar9 = 0.0;
    dVar8 = 0.0;
    for (; local_48._M_impl.super__Vector_impl_data._M_start !=
           local_48._M_impl.super__Vector_impl_data._M_finish;
        local_48._M_impl.super__Vector_impl_data._M_start =
             local_48._M_impl.super__Vector_impl_data._M_start + 1) {
      dVar7 = dVar6 - *local_48._M_impl.super__Vector_impl_data._M_start;
      dVar8 = dVar8 + dVar7 * dVar7;
      dVar9 = dVar9 + dVar7 * dVar7 * dVar7;
    }
    dVar6 = pow(dVar8,1.5);
    __first._M_current = (double *)*last._M_current;
    __last._M_current = (double *)last._M_current[1];
    dVar1 = std::
            __count_if<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_pred<Catch::Benchmark::Detail::bootstrap<double(*&)(__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>)>(double,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::vector<double,std::allocator<double>>const&,double(*&)(__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>))::_lambda(double)_1_>>
                      (__first,__last,__pred);
    lVar5 = (long)__last._M_current - (long)__first._M_current >> 3;
    dVar8 = (double)dVar1 / (double)lVar5;
    if ((dVar8 != 0.0) || (NAN(dVar8))) {
      dVar8 = normal_quantile(dVar8);
      dVar7 = normal_quantile((1.0 - confidence_level) * 0.5);
      dVar6 = -dVar9 / (dVar6 * 6.0);
      local_50.n = lVar5;
      lVar2 = bootstrap<double_(*&)(__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)>
              ::anon_class_8_1_54a3980e::operator()
                        (&local_50,(dVar8 + dVar7) / (dVar6 * (dVar8 + dVar7) + 1.0) + dVar8);
      lVar3 = bootstrap<double_(*&)(__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)>
              ::anon_class_8_1_54a3980e::operator()
                        (&local_50,(dVar8 - dVar7) / (dVar6 * (dVar8 - dVar7) + 1.0) + dVar8);
      lVar4 = 0;
      if (0 < lVar2) {
        lVar4 = lVar2;
      }
      lVar2 = lVar5 + -1;
      if (lVar3 <= lVar5 + -1) {
        lVar2 = lVar3;
      }
      __return_storage_ptr__->point = (double)__pred._M_pred.point;
      dVar6 = *last._M_current;
      __return_storage_ptr__->lower_bound = *(double *)((long)dVar6 + lVar4 * 8);
      __return_storage_ptr__->upper_bound = *(double *)((long)dVar6 + lVar2 * 8);
      __return_storage_ptr__->confidence_interval = confidence_level;
    }
    else {
      __return_storage_ptr__->point = (double)__pred._M_pred.point;
      __return_storage_ptr__->lower_bound = (double)__pred._M_pred.point;
      __return_storage_ptr__->upper_bound = (double)__pred._M_pred.point;
      __return_storage_ptr__->confidence_interval = confidence_level;
    }
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

Estimate<double> bootstrap( double confidence_level,
                                        std::vector<double>::iterator first,
                                        std::vector<double>::iterator last,
                                        sample const& resample,
                                        Estimator&& estimator ) {
                auto n_samples = last - first;

                double point = estimator(first, last);
                // Degenerate case with a single sample
                if (n_samples == 1) return { point, point, point, confidence_level };

                sample jack = jackknife(estimator, first, last);
                double jack_mean = mean(jack.begin(), jack.end());
                double sum_squares = 0, sum_cubes = 0;
                for (double x : jack) {
                    auto difference = jack_mean - x;
                    auto square = difference * difference;
                    auto cube = square * difference;
                    sum_squares += square; sum_cubes += cube;
                }

                double accel = sum_cubes / (6 * std::pow(sum_squares, 1.5));
                long n = static_cast<long>(resample.size());
                double prob_n = std::count_if(resample.begin(), resample.end(), [point](double x) { return x < point; }) / static_cast<double>(n);
                // degenerate case with uniform samples
                if ( directCompare( prob_n, 0. ) ) {
                    return { point, point, point, confidence_level };
                }

                double bias = normal_quantile(prob_n);
                double z1 = normal_quantile((1. - confidence_level) / 2.);

                auto cumn = [n]( double x ) -> long {
                    return std::lround( normal_cdf( x ) * static_cast<double>(n) );
                };
                auto a = [bias, accel](double b) { return bias + b / (1. - accel * b); };
                double b1 = bias + z1;
                double b2 = bias - z1;
                double a1 = a(b1);
                double a2 = a(b2);
                auto lo = static_cast<size_t>((std::max)(cumn(a1), 0l));
                auto hi = static_cast<size_t>((std::min)(cumn(a2), n - 1));

                return { point, resample[lo], resample[hi], confidence_level };
            }